

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

int __thiscall google::protobuf::io::CopyingInputStream::Skip(CopyingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 local_1038 [8];
  char junk [4096];
  
  iVar1 = 0;
  do {
    iVar3 = iVar1;
    uVar4 = count - iVar3;
    if (uVar4 == 0 || count < iVar3) {
      return iVar3;
    }
    uVar5 = (ulong)uVar4;
    if (0xfff < (int)uVar4) {
      uVar5 = 0x1000;
    }
    iVar2 = (*this->_vptr_CopyingInputStream[2])(this,local_1038,uVar5);
    iVar1 = iVar2 + iVar3;
  } while (0 < iVar2);
  return iVar3;
}

Assistant:

int CopyingInputStream::Skip(int count) {
  char junk[4096];
  int skipped = 0;
  while (skipped < count) {
    int bytes = Read(junk, std::min(count - skipped,
                                    implicit_cast<int>(sizeof(junk))));
    if (bytes <= 0) {
      // EOF or read error.
      return skipped;
    }
    skipped += bytes;
  }
  return skipped;
}